

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conditionalestimator.cxx
# Opt level: O0

void __thiscall ConditionalEstimator::~ConditionalEstimator(ConditionalEstimator *this)

{
  int local_14;
  int i;
  ConditionalEstimator *this_local;
  
  (this->super_Estimator).super_Parametric._vptr_Parametric =
       (_func_int **)&PTR__ConditionalEstimator_0018e740;
  if ((this->condSamples != (double *)0x0) && (this->condSamples != (double *)0x0)) {
    operator_delete__(this->condSamples);
  }
  if ((this->aOne != (double *)0x0) && (this->aOne != (double *)0x0)) {
    operator_delete__(this->aOne);
  }
  if ((this->aTwo != (double *)0x0) && (this->aTwo != (double *)0x0)) {
    operator_delete__(this->aTwo);
  }
  if ((this->aThree != (double *)0x0) && (this->aTwo != (double *)0x0)) {
    operator_delete__(this->aTwo);
  }
  if ((this->aEvents != (double *)0x0) && (this->aEvents != (double *)0x0)) {
    operator_delete__(this->aEvents);
  }
  if (this->aDist != (double **)0x0) {
    for (local_14 = 0; local_14 < this->nPre + this->nPost + 1; local_14 = local_14 + 1) {
      if (this->aDist[local_14] != (double *)0x0) {
        operator_delete__(this->aDist[local_14]);
      }
    }
    if (this->aDist != (double **)0x0) {
      operator_delete(this->aDist,8);
    }
  }
  Ring<double>::~Ring(&this->condConditionRing);
  Ring<bool>::~Ring(&this->condEventRing);
  Ring<double>::~Ring(&this->condSampleRing);
  Estimator::~Estimator(&this->super_Estimator);
  return;
}

Assistant:

ConditionalEstimator::~ConditionalEstimator()
{
	if(condSamples) delete[] condSamples;
	if(aOne) delete[] aOne;
	if(aTwo) delete[] aTwo;
	if(aThree) delete[] aTwo;
	if(aEvents) delete[] aEvents;
	if(aDist) {
		for(int i=0; i<nPre+nPost+1; i++)
			delete[] aDist[i];
		delete aDist;
	}
}